

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int x9_62_create_key_exchange
              (ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx)

{
  int iVar1;
  EC_GROUP *group;
  EC_KEY *pEVar2;
  st_x9_62_keyex_context_t *ctx;
  st_x9_62_keyex_context_t *local_28;
  
  local_28 = (st_x9_62_keyex_context_t *)0x0;
  group = EC_GROUP_new_by_curve_name((int)algo->data);
  iVar1 = 0x203;
  if (group != (EC_GROUP *)0x0) {
    iVar1 = x9_62_create_context(algo,&local_28);
    if (iVar1 == 0) {
      pEVar2 = ecdh_generate_key((EC_GROUP *)group);
      local_28->privkey = pEVar2;
      iVar1 = 0x203;
      if (pEVar2 != (EC_KEY *)0x0) {
        iVar1 = x9_62_setup_pubkey(local_28);
      }
    }
  }
  if (group != (EC_GROUP *)0x0) {
    EC_GROUP_free(group);
  }
  if (iVar1 != 0) {
    if (local_28 != (st_x9_62_keyex_context_t *)0x0) {
      x9_62_free_context(local_28);
    }
    local_28 = (st_x9_62_keyex_context_t *)0x0;
  }
  *_ctx = &local_28->super;
  return iVar1;
}

Assistant:

static int x9_62_create_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx)
{
    EC_GROUP *group = NULL;
    struct st_x9_62_keyex_context_t *ctx = NULL;
    int ret;

    /* FIXME use a global? */
    if ((group = EC_GROUP_new_by_curve_name((int)algo->data)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((ret = x9_62_create_context(algo, &ctx)) != 0)
        goto Exit;
    if ((ctx->privkey = ecdh_generate_key(group)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((ret = x9_62_setup_pubkey(ctx)) != 0)
        goto Exit;
    ret = 0;

Exit:
    if (group != NULL)
        EC_GROUP_free(group);
    if (ret == 0) {
        *_ctx = &ctx->super;
    } else {
        if (ctx != NULL)
            x9_62_free_context(ctx);
        *_ctx = NULL;
    }

    return ret;
}